

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O0

void draw_all(ALLEGRO_JOYSTICK *joy)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RDI;
  undefined8 uVar5;
  undefined8 in_XMM1_Qa;
  ALLEGRO_JOYSTICK *unaff_retaddr;
  int cy;
  int cx;
  int v;
  int u;
  int i;
  int height;
  int width;
  ALLEGRO_BITMAP *bmp;
  int button;
  undefined4 uVar6;
  
  uVar3 = al_get_target_bitmap();
  iVar2 = al_get_bitmap_width(uVar3);
  al_get_bitmap_height(uVar3);
  uVar5 = al_map_rgb(0xff,0xff,0xc0);
  button = (int)in_XMM1_Qa;
  uVar6 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  al_clear_to_color(uVar5,in_XMM1_Qa);
  pAVar1 = font;
  if (in_RDI != 0) {
    uVar4 = al_get_joystick_name(in_RDI);
    al_draw_textf(black._0_8_,black._8_8_,(float)(iVar2 / 2),0x41200000,pAVar1,1,"Joystick: %s",
                  uVar4);
  }
  for (iVar2 = 0; iVar2 < num_sticks; iVar2 = iVar2 + 1) {
    draw_joystick_axes(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                       (int)((ulong)uVar3 >> 0x20));
  }
  for (iVar2 = 0; iVar2 < num_buttons; iVar2 = iVar2 + 1) {
    draw_joystick_button
              ((ALLEGRO_JOYSTICK *)CONCAT44(iVar2,uVar6),button,SUB81((ulong)uVar5 >> 0x38,0));
  }
  al_flip_display();
  return;
}

Assistant:

static void draw_all(ALLEGRO_JOYSTICK *joy)
{
   ALLEGRO_BITMAP *bmp = al_get_target_bitmap();
   int width = al_get_bitmap_width(bmp);
   int height = al_get_bitmap_height(bmp);
   int i;

   al_clear_to_color(al_map_rgb(0xff, 0xff, 0xc0));

   if (joy) {
      al_draw_textf(font, black, width / 2, 10, ALLEGRO_ALIGN_CENTRE,
         "Joystick: %s", al_get_joystick_name(joy));
   }

   for (i = 0; i < num_sticks; i++) {
      int u = i%4;
      int v = i/4;
      int cx = (u + 0.5) * width/4;
      int cy = (v + 0.5) * height/6;
      draw_joystick_axes(joy, cx, cy, i);
   }

   for (i = 0; i < num_buttons; i++) {
      draw_joystick_button(joy, i, joys_buttons[i]);
   }

   al_flip_display();
}